

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O0

void aes_ecb4x(uchar *out,uint32_t *ivw,uint64_t *sk_exp,uint nrounds)

{
  uint in_ECX;
  uint64_t *in_RDX;
  void *in_RSI;
  uint64_t *unaff_retaddr;
  uint i;
  uint64_t q [8];
  uint32_t w [16];
  uint64_t *in_stack_00000298;
  uint32_t *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  uint uVar1;
  uint64_t local_a8 [4];
  uint64_t uStack_88;
  uint64_t *in_stack_ffffffffffffff80;
  uint32_t local_68 [19];
  uint local_1c;
  uint64_t *local_18;
  
  local_1c = in_ECX;
  local_18 = in_RDX;
  memcpy(local_68,in_RSI,0x40);
  for (uVar1 = 0; uVar1 < 4; uVar1 = uVar1 + 1) {
    br_aes_ct64_interleave_in(local_a8 + uVar1,local_a8 + (uVar1 + 4),local_68 + (uVar1 << 2));
  }
  br_aes_ct64_ortho(in_stack_ffffffffffffff80);
  add_round_key(local_a8,local_18);
  for (uVar1 = 1; uVar1 < local_1c; uVar1 = uVar1 + 1) {
    br_aes_ct64_bitslice_Sbox(in_stack_00000298);
    shift_rows(local_a8);
    mix_columns(unaff_retaddr);
    add_round_key(local_a8,local_18 + (uVar1 << 3));
  }
  br_aes_ct64_bitslice_Sbox(in_stack_00000298);
  shift_rows(local_a8);
  add_round_key(local_a8,local_18 + (local_1c << 3));
  br_aes_ct64_ortho(in_stack_ffffffffffffff80);
  for (uVar1 = 0; uVar1 < 4; uVar1 = uVar1 + 1) {
    br_aes_ct64_interleave_out(local_68 + (uVar1 << 2),local_a8[uVar1],local_a8[uVar1 + 4]);
  }
  br_range_enc32le((uchar *)CONCAT44(uVar1,in_stack_ffffffffffffff50),in_stack_ffffffffffffff48,
                   0x107a2d);
  return;
}

Assistant:

static void aes_ecb4x(unsigned char out[64], const uint32_t ivw[16], const uint64_t *sk_exp, unsigned int nrounds) {
    uint32_t w[16];
    uint64_t q[8];
    unsigned int i;

    memcpy(w, ivw, sizeof(w));
    for (i = 0; i < 4; i++) {
        br_aes_ct64_interleave_in(&q[i], &q[i + 4], w + (i << 2));
    }
    br_aes_ct64_ortho(q);


    add_round_key(q, sk_exp);
    for (i = 1; i < nrounds; i++) {
        br_aes_ct64_bitslice_Sbox(q);
        shift_rows(q);
        mix_columns(q);
        add_round_key(q, sk_exp + (i << 3));
    }
    br_aes_ct64_bitslice_Sbox(q);
    shift_rows(q);
    add_round_key(q, sk_exp + 8 * nrounds);

    br_aes_ct64_ortho(q);
    for (i = 0; i < 4; i ++) {
        br_aes_ct64_interleave_out(w + (i << 2), q[i], q[i + 4]);
    }
    br_range_enc32le(out, w, 16);
}